

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::LabelInstr::RemoveLabelRef(LabelInstr *this,BranchInstr *branchRef)

{
  code *pcVar1;
  bool bVar2;
  Type *ppBVar3;
  undefined4 *puVar4;
  BranchInstr **branchEntry;
  EditingIterator iter;
  BranchInstr *branchRef_local;
  LabelInstr *this_local;
  
  iter.super_EditingIterator.last = (NodeBase *)branchRef;
  SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&branchEntry,
             &(this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>);
  do {
    bVar2 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)&branchEntry);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x661,"((0))","Branch not found on labelRef list");
      if (bVar2) {
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    ppBVar3 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&branchEntry);
  } while (*ppBVar3 != (Type)iter.super_EditingIterator.last);
  SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
            ((EditingIterator *)&branchEntry);
  return;
}

Assistant:

void
LabelInstr::RemoveLabelRef(BranchInstr *branchRef)
{
    FOREACH_SLISTCOUNTED_ENTRY_EDITING(BranchInstr*, branchEntry, &this->labelRefs, iter)
    {
        if (branchEntry == branchRef)
        {
            iter.RemoveCurrent();
            return;
        }
    } NEXT_SLISTCOUNTED_ENTRY_EDITING;

    AssertMsg(UNREACHED, "Branch not found on labelRef list");
}